

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<long_long>::resize_internal(QList<long_long> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<long_long> *this_00;
  __off_t __length;
  QArrayDataPointer<long_long> *in_RSI;
  QArrayDataPointer<long_long> *in_RDI;
  QArrayDataPointer<long_long> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<long_long> *this_01;
  QArrayDataPointer<long_long> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<long_long> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<long_long> *__file;
  
  QArrayDataPointer<long_long>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<long_long>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<long_long> *)capacity((QList<long_long> *)0x145b01);
    qVar2 = QArrayDataPointer<long_long>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<long_long> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<long_long> *)QArrayDataPointer<long_long>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<long_long>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<long_long>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (longlong **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}